

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O2

VkResult __thiscall
Fossilize::VulkanDevice::create_sampler_with_ycbcr_remap
          (VulkanDevice *this,VkSamplerCreateInfo *create_info,VkSampler *sampler)

{
  VkResult VVar1;
  VkSamplerCreateInfo *pVVar2;
  VkSamplerYcbcrConversion conv;
  VkSamplerYcbcrConversionCreateInfo ycbcr;
  value_type local_80;
  VkSamplerYcbcrConversionCreateInfo local_78;
  
  local_80 = (value_type)0x0;
  pVVar2 = create_info;
  while( true ) {
    do {
      pVVar2 = (VkSamplerCreateInfo *)pVVar2->pNext;
      if (pVVar2 == (VkSamplerCreateInfo *)0x0) {
        VVar1 = (*vkCreateSampler)(this->device,create_info,(VkAllocationCallbacks *)0x0,sampler);
        return VVar1;
      }
    } while (pVVar2->sType != VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO);
    local_78.sType = pVVar2->sType;
    local_78._4_4_ = *(undefined4 *)&pVVar2->field_0x4;
    local_78.format = pVVar2->flags;
    local_78.ycbcrModel = pVVar2->magFilter;
    local_78.ycbcrRange = pVVar2->minFilter;
    local_78.components.r = pVVar2->mipmapMode;
    local_78.components.g = pVVar2->addressModeU;
    local_78.components.b = pVVar2->addressModeV;
    local_78.components.a = pVVar2->addressModeW;
    local_78.xChromaOffset = (VkChromaLocation)pVVar2->mipLodBias;
    local_78.yChromaOffset = pVVar2->anisotropyEnable;
    local_78.chromaFilter = (VkFilter)pVVar2->maxAnisotropy;
    local_78.forceExplicitReconstruction = pVVar2->compareEnable;
    local_78._60_4_ = pVVar2->compareOp;
    local_78.pNext = (void *)0x0;
    VVar1 = (*vkCreateSamplerYcbcrConversionKHR)
                      (this->device,&local_78,(VkAllocationCallbacks *)0x0,&local_80);
    if (VVar1 != VK_SUCCESS) break;
    std::vector<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>::
    push_back(&this->ycbcr_conversions,&local_80);
    pVVar2->sType = VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO;
    *(value_type *)&pVVar2->flags = local_80;
  }
  return VVar1;
}

Assistant:

VkResult VulkanDevice::create_sampler_with_ycbcr_remap(const VkSamplerCreateInfo *create_info, VkSampler *sampler)
{
	VkSamplerYcbcrConversion conv = VK_NULL_HANDLE;
	VkResult vr;

	// Kinda hacky. Resolve Ycbcr sampler objects.
	// Replace the create info inline.
	const auto *next = static_cast<const VkBaseInStructure *>(create_info->pNext);
	while (next)
	{
		if (next->sType == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO)
		{
			auto ycbcr = *reinterpret_cast<const VkSamplerYcbcrConversionCreateInfo *>(next);
			ycbcr.pNext = nullptr;

			if ((vr = vkCreateSamplerYcbcrConversionKHR(device, &ycbcr, nullptr, &conv)) != VK_SUCCESS)
				return vr;

			ycbcr_conversions.push_back(conv);

			// Kinda icky, but we know the conversion info is smaller than the create info.
			// It's also safe to mutate the input structs we get from enqueue_create_sampler().
			auto *mut_next = const_cast<VkBaseInStructure *>(next);
			mut_next->sType = VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO;
			reinterpret_cast<VkSamplerYcbcrConversionInfo *>(mut_next)->conversion = conv;
		}

		next = static_cast<const VkBaseInStructure *>(next->pNext);
	}

	if ((vr = vkCreateSampler(device, create_info, nullptr, sampler)) != VK_SUCCESS)
		return vr;

	return VK_SUCCESS;
}